

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix4.h
# Opt level: O2

CMatrix4<float> * __thiscall
irr::core::CMatrix4<float>::setRotationRadians(CMatrix4<float> *this,vector3d<float> *rotation)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar1 = cos((double)rotation->X);
  dVar2 = sin((double)rotation->X);
  dVar3 = cos((double)rotation->Y);
  dVar4 = sin((double)rotation->Y);
  dVar5 = cos((double)rotation->Z);
  dVar6 = sin((double)rotation->Z);
  *(ulong *)this->M = CONCAT44((float)(dVar3 * dVar6),(float)(dVar3 * dVar5));
  this->M[2] = -(float)dVar4;
  *(ulong *)(this->M + 4) =
       CONCAT44((float)(dVar2 * dVar4 * dVar6 + dVar5 * dVar1),
                (float)(dVar2 * dVar4 * dVar5 + -dVar1 * dVar6));
  this->M[6] = (float)(dVar2 * dVar3);
  *(ulong *)(this->M + 8) =
       CONCAT44((float)(dVar4 * dVar1 * dVar6 + -dVar2 * dVar5),
                (float)(dVar4 * dVar1 * dVar5 + dVar6 * dVar2));
  this->M[10] = (float)(dVar1 * dVar3);
  return this;
}

Assistant:

inline CMatrix4<T> &CMatrix4<T>::setRotationRadians(const vector3d<T> &rotation)
{
	const f64 cr = cos(rotation.X);
	const f64 sr = sin(rotation.X);
	const f64 cp = cos(rotation.Y);
	const f64 sp = sin(rotation.Y);
	const f64 cy = cos(rotation.Z);
	const f64 sy = sin(rotation.Z);

	M[0] = (T)(cp * cy);
	M[1] = (T)(cp * sy);
	M[2] = (T)(-sp);

	const f64 srsp = sr * sp;
	const f64 crsp = cr * sp;

	M[4] = (T)(srsp * cy - cr * sy);
	M[5] = (T)(srsp * sy + cr * cy);
	M[6] = (T)(sr * cp);

	M[8] = (T)(crsp * cy + sr * sy);
	M[9] = (T)(crsp * sy - sr * cy);
	M[10] = (T)(cr * cp);
#if defined(USE_MATRIX_TEST)
	definitelyIdentityMatrix = false;
#endif
	return *this;
}